

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrix.h
# Opt level: O0

Matrix<unsigned_char> * ZXing::ToMatrix<unsigned_char>(BitMatrix *in,uchar black,uchar white)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined1 in_CL;
  undefined1 in_DL;
  BitMatrix *in_RSI;
  Matrix<unsigned_char> *in_RDI;
  int x;
  int y;
  Matrix<unsigned_char> *res;
  int in_stack_ffffffffffffffa8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffe4;
  value_t val;
  int in_stack_ffffffffffffffe8;
  int iVar5;
  undefined2 in_stack_ffffffffffffffec;
  undefined1 uVar6;
  uint width;
  
  val = (value_t)((uint)in_stack_ffffffffffffffe4 >> 0x18);
  width = CONCAT22((short)(CONCAT13(in_DL,CONCAT12(in_CL,in_stack_ffffffffffffffec)) >> 0x10),
                   in_stack_ffffffffffffffec) & 0xffff00ff;
  BitMatrix::width(in_RSI);
  BitMatrix::height(in_RSI);
  Matrix<unsigned_char>::Matrix((Matrix<unsigned_char> *)in_RSI,width,in_stack_ffffffffffffffe8,val)
  ;
  iVar5 = 0;
  while (iVar4 = iVar5, iVar2 = BitMatrix::height(in_RSI), iVar5 < iVar2) {
    for (iVar5 = 0; iVar2 = iVar5, iVar3 = BitMatrix::width(in_RSI), iVar5 < iVar3;
        iVar5 = iVar5 + 1) {
      iVar5 = iVar2;
      iVar3 = iVar4;
      bVar1 = BitMatrix::get((BitMatrix *)CONCAT44(in_stack_ffffffffffffffb4,iVar4),iVar2,
                             in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffb4);
      if (bVar1) {
        uVar6 = (undefined1)(width >> 0x18);
      }
      else {
        uVar6 = (undefined1)(width >> 0x10);
      }
      in_stack_ffffffffffffffa8 = CONCAT13(uVar6,(int3)in_stack_ffffffffffffffa8);
      Matrix<unsigned_char>::set
                ((Matrix<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffb4,iVar4),iVar2,
                 in_stack_ffffffffffffffa8,'\0');
      iVar4 = iVar3;
    }
    iVar5 = iVar4 + 1;
  }
  return in_RDI;
}

Assistant:

Matrix<T> ToMatrix(const BitMatrix& in, T black = 0, T white = ~0)
{
	Matrix<T> res(in.width(), in.height());
	for (int y = 0; y < in.height(); ++y)
		for (int x = 0; x < in.width(); ++x)
			res.set(x, y, in.get(x, y) ? black : white);
	return res;
}